

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::DataManReader::DoGetSync
          (DataManReader *this,Variable<signed_char> *variable,int8_t *data)

{
  int commRank;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Engine","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DataManReader","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"GetSync","");
  commRank = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_50,&local_70,&local_90,&(variable->super_VariableBase).m_Name,0,commRank,5,
              this->m_Verbosity,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  GetDeferredCommon<signed_char>(this,variable,data);
  return;
}

Assistant:

void DataManReader::DoClose(const int transportIndex)
{
    m_SubscriberThreadActive = false;
    m_RequesterThreadActive = false;
    if (m_SubscriberThread.joinable())
    {
        m_SubscriberThread.join();
    }
    if (m_RequesterThread.joinable())
    {
        m_RequesterThread.join();
    }
    m_IsClosed = true;
    if (m_MonitorActive)
    {
        m_Monitor.OutputCsv(m_Name);
        m_Monitor.OutputJson(m_Name);
    }
}